

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validatevulnerability.cpp
# Opt level: O0

void __thiscall ValidateVulnerability::StoreLine(ValidateVulnerability *this)

{
  size_t sVar1;
  ValidateVulnerability *this_local;
  
  (this->super_Validate).lineno_ = (this->super_Validate).lineno_ + 1;
  this->prevVulID_ = (this->v_).vulnerability_id;
  this->prevIntBinID_ = (this->v_).intensity_bin_id;
  this->prevDamageBinID_ = (this->v_).damage_bin_id;
  if (this->maxDamageBin_ < (this->v_).damage_bin_id) {
    this->maxDamageBin_ = (this->v_).damage_bin_id;
  }
  sVar1 = strlen((this->super_Validate).line_);
  memcpy(this->prevLine_,&this->super_Validate,sVar1 + 1);
  sVar1 = strlen((this->super_Validate).line_);
  this->prevLine_[sVar1 - 1] = '\0';
  return;
}

Assistant:

inline void ValidateVulnerability::StoreLine() {
/* Store current line before going to the next one. Used in some error message
 * output. */

    ++lineno_;
    prevVulID_ = v_.vulnerability_id;
    prevIntBinID_ = v_.intensity_bin_id;
    prevDamageBinID_ = v_.damage_bin_id;
    if (v_.damage_bin_id > maxDamageBin_) {
      // Maximum damage bin index is a required argument to convert
      // vulnerability csv files to binary format with vulnerabilitytobin
      maxDamageBin_ = v_.damage_bin_id;
    }
    memcpy(prevLine_, line_, strlen(line_) + 1);
    prevLine_[strlen(line_) - 1] = '\0';

}